

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.cpp
# Opt level: O2

RenderPassVkImpl * __thiscall
Diligent::RenderPassCache::GetRenderPass(RenderPassCache *this,RenderPassCacheKey *Key)

{
  SHADING_RATE_FORMAT SVar1;
  byte bVar2;
  Uint8 UVar3;
  bool bVar4;
  TEXTURE_FORMAT TVar5;
  RenderDeviceVkImpl *pRVar6;
  RenderPassAttachmentDesc *pRVar7;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> RVar8;
  _Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
  _Var9;
  ostream *poVar10;
  TextureFormatAttribs *pTVar11;
  char (*in_RCX) [39];
  array<Diligent::AttachmentReference,_10UL> *paVar12;
  Uint32 rt;
  ulong uVar13;
  char *pcVar14;
  AttachmentReference *pAVar15;
  RenderPassVkImpl *pRVar16;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_false,_true>,_bool>
  pVar17;
  Uint32 local_3a8 [2];
  TEXTURE_FORMAT local_3a0;
  RefCntAutoPtr<Diligent::RenderPassVkImpl> pRenderPass;
  RenderPassDesc RPDesc;
  ShadingRateAttachment ShadingRate;
  string msg_1;
  string PassName;
  SubpassDesc Subpass;
  array<Diligent::RenderPassAttachmentDesc,_10UL> Attachments;
  array<Diligent::AttachmentReference,_10UL> AttachmentReferences;
  stringstream PassNameSS;
  ostream local_1a8 [376];
  
  std::mutex::lock(&this->m_Mutex);
  _Var9._M_cur = (__node_type *)
                 std::
                 _Hashtable<Diligent::RenderPassCache::RenderPassCacheKey,_std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_std::allocator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,_Diligent::RenderPassCache::RenderPassCacheKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->m_Cache)._M_h,Key);
  if (_Var9._M_cur == (__node_type *)0x0) {
    std::array<Diligent::RenderPassAttachmentDesc,_10UL>::array(&Attachments);
    AttachmentReferences._M_elems[8].AttachmentIndex = 0;
    AttachmentReferences._M_elems[8].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[9].AttachmentIndex = 0;
    AttachmentReferences._M_elems[9].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[6].AttachmentIndex = 0;
    AttachmentReferences._M_elems[6].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[7].AttachmentIndex = 0;
    AttachmentReferences._M_elems[7].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[4].AttachmentIndex = 0;
    AttachmentReferences._M_elems[4].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[5].AttachmentIndex = 0;
    AttachmentReferences._M_elems[5].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[2].AttachmentIndex = 0;
    AttachmentReferences._M_elems[2].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[3].AttachmentIndex = 0;
    AttachmentReferences._M_elems[3].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[0].AttachmentIndex = 0;
    AttachmentReferences._M_elems[0].State = RESOURCE_STATE_UNKNOWN;
    AttachmentReferences._M_elems[1].AttachmentIndex = 0;
    AttachmentReferences._M_elems[1].State = RESOURCE_STATE_UNKNOWN;
    if (Key->EnableVRS == true) {
      pRVar6 = this->m_DeviceVkImpl;
      SVar1 = (pRVar6->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate.
              Format;
      if (SVar1 == SHADING_RATE_FORMAT_PALETTE) {
        local_3a0 = TEX_FORMAT_R8_UINT;
      }
      else if (SVar1 == SHADING_RATE_FORMAT_UNORM8) {
        local_3a0 = TEX_FORMAT_RG8_UNORM;
      }
      else {
        FormatString<char[31]>
                  ((string *)&PassNameSS,(char (*) [31])"Unexpected shading rate format");
        in_RCX = (char (*) [39])0xd4;
        DebugAssertionFailed
                  (_PassNameSS,"GetRenderPass",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                   ,0xd4);
        std::__cxx11::string::~string((string *)&PassNameSS);
        local_3a0 = TEX_FORMAT_UNKNOWN;
      }
      local_3a8 = *&(pRVar6->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate
                    .MaxTileSize;
    }
    else {
      local_3a0 = TEX_FORMAT_UNKNOWN;
      local_3a8[0] = 0;
      local_3a8[1] = 0;
    }
    Subpass.InputAttachmentCount = 0;
    Subpass.pInputAttachments = (AttachmentReference *)0x0;
    Subpass.RenderTargetAttachmentCount = 0;
    Subpass.pRenderTargetAttachments = (AttachmentReference *)0x0;
    Subpass.pResolveAttachments._0_4_ = 0;
    Subpass.pResolveAttachments._4_4_ = 0;
    Subpass.pDepthStencilAttachment._0_4_ = 0;
    Subpass.pDepthStencilAttachment._4_4_ = 0;
    Subpass.PreserveAttachmentCount = 0;
    Subpass.pPreserveAttachments = (Uint32 *)0x0;
    Subpass.pShadingRateAttachment = (ShadingRateAttachment *)0x0;
    ShadingRate.Attachment.AttachmentIndex = 0;
    ShadingRate.Attachment.State = RESOURCE_STATE_UNKNOWN;
    ShadingRate.TileSize[0] = 0;
    ShadingRate.TileSize[1] = 0;
    bVar2 = Key->NumRenderTargets;
    TVar5 = Key->DSVFormat;
    UVar3 = Key->SampleCount;
    bVar4 = Key->ReadOnlyDSV;
    if (8 < bVar2) {
      FormatString<char[26],char[39]>
                ((string *)&PassNameSS,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"NumRenderTargets <= MAX_RENDER_TARGETS",in_RCX);
      DebugAssertionFailed
                (_PassNameSS,"GetImplicitRenderPassDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                 ,0x53);
      std::__cxx11::string::~string((string *)&PassNameSS);
    }
    RPDesc.super_DeviceObjectAttribs.Name = (Char *)0x0;
    if (TVar5 == TEX_FORMAT_UNKNOWN) {
      paVar12 = (array<Diligent::AttachmentReference,_10UL> *)0x0;
    }
    else {
      Attachments._M_elems[0].InitialState = (uint)bVar4 * 0x40 + RESOURCE_STATE_DEPTH_WRITE;
      Attachments._M_elems[0].LoadOp = ATTACHMENT_LOAD_OP_LOAD;
      Attachments._M_elems[0].StoreOp = ATTACHMENT_STORE_OP_STORE;
      Attachments._M_elems[0].StencilLoadOp = ATTACHMENT_LOAD_OP_LOAD;
      Attachments._M_elems[0].StencilStoreOp = ATTACHMENT_STORE_OP_STORE;
      paVar12 = &AttachmentReferences;
      AttachmentReferences._M_elems[0] =
           (AttachmentReference)((ulong)Attachments._M_elems[0].InitialState << 0x20);
      Attachments._M_elems[0].Format = TVar5;
      Attachments._M_elems[0].SampleCount = UVar3;
      Attachments._M_elems[0].FinalState = Attachments._M_elems[0].InitialState;
    }
    uVar13 = (ulong)(TVar5 != TEX_FORMAT_UNKNOWN);
    RPDesc.pAttachments = Attachments._M_elems;
    pAVar15 = (AttachmentReference *)0x0;
    Subpass.RenderTargetAttachmentCount = (Uint32)bVar2;
    Subpass.pRenderTargetAttachments = AttachmentReferences._M_elems + uVar13;
    if (bVar2 == 0) {
      Subpass.pRenderTargetAttachments = pAVar15;
    }
    for (; RPDesc.AttachmentCount = (Uint32)uVar13,
        (AttachmentReference *)(ulong)Subpass.RenderTargetAttachmentCount != pAVar15;
        pAVar15 = (AttachmentReference *)((long)&pAVar15->AttachmentIndex + 1)) {
      if (Key->RTVFormats[(long)pAVar15] == TEX_FORMAT_UNKNOWN) {
        RPDesc.AttachmentCount = 0xffffffff;
      }
      else {
        Attachments._M_elems[uVar13].Format = Key->RTVFormats[(long)pAVar15];
        Attachments._M_elems[uVar13].SampleCount = UVar3;
        pRVar7 = Attachments._M_elems + uVar13;
        pRVar7->LoadOp = ATTACHMENT_LOAD_OP_LOAD;
        pRVar7->StoreOp = ATTACHMENT_STORE_OP_STORE;
        pRVar7->StencilLoadOp = ATTACHMENT_LOAD_OP_DISCARD;
        pRVar7->StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
        Attachments._M_elems[uVar13].InitialState = RESOURCE_STATE_RENDER_TARGET;
        Attachments._M_elems[uVar13].FinalState = RESOURCE_STATE_RENDER_TARGET;
        Subpass.pRenderTargetAttachments[(long)pAVar15].State = RESOURCE_STATE_RENDER_TARGET;
        uVar13 = (ulong)(RPDesc.AttachmentCount + 1);
      }
      Subpass.pRenderTargetAttachments[(long)pAVar15].AttachmentIndex = RPDesc.AttachmentCount;
    }
    if (local_3a0 != TEX_FORMAT_UNKNOWN) {
      Attachments._M_elems[uVar13].Format = local_3a0;
      pRVar7 = Attachments._M_elems + uVar13;
      pRVar7->SampleCount = '\x01';
      pRVar7->LoadOp = ATTACHMENT_LOAD_OP_LOAD;
      pRVar7->StoreOp = ATTACHMENT_STORE_OP_DISCARD;
      pRVar7->StencilLoadOp = ATTACHMENT_LOAD_OP_DISCARD;
      Attachments._M_elems[uVar13].StencilStoreOp = ATTACHMENT_STORE_OP_DISCARD;
      Attachments._M_elems[uVar13].InitialState = RESOURCE_STATE_MAX_BIT;
      Attachments._M_elems[uVar13].FinalState = RESOURCE_STATE_MAX_BIT;
      Subpass.pShadingRateAttachment = &ShadingRate;
      ShadingRate.Attachment.State = RESOURCE_STATE_MAX_BIT;
      ShadingRate.Attachment.AttachmentIndex = RPDesc.AttachmentCount;
      ShadingRate.TileSize[0] = local_3a8[0];
      ShadingRate.TileSize[1] = local_3a8[1];
      RPDesc.AttachmentCount = RPDesc.AttachmentCount + 1;
    }
    RPDesc.SubpassCount = 1;
    RPDesc.pSubpasses = &Subpass;
    RPDesc.DependencyCount = 0;
    RPDesc.pDependencies = (SubpassDependencyDesc *)0x0;
    Subpass.InputAttachmentCount = 0;
    Subpass.pInputAttachments = (AttachmentReference *)0x0;
    Subpass.pResolveAttachments._0_4_ = 0;
    Subpass.pResolveAttachments._4_4_ = 0;
    Subpass.pDepthStencilAttachment._0_4_ = SUB84(paVar12,0);
    Subpass.pDepthStencilAttachment._4_4_ = (undefined4)((ulong)paVar12 >> 0x20);
    Subpass.PreserveAttachmentCount = 0;
    Subpass.pPreserveAttachments = (Uint32 *)0x0;
    std::__cxx11::stringstream::stringstream((stringstream *)&PassNameSS);
    poVar10 = std::operator<<(local_1a8,"Implicit render pass: RT count: ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10,"; sample count: ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10,"; DSV Format: ");
    pTVar11 = GetTextureFormatAttribs(Key->DSVFormat);
    std::operator<<(poVar10,pTVar11->Name);
    if (Key->NumRenderTargets != '\0') {
      pcVar14 = "; RTV Formats: ";
      if (Key->NumRenderTargets == '\x01') {
        pcVar14 = "; RTV Format: ";
      }
      std::operator<<(local_1a8,pcVar14);
      for (uVar13 = 0; uVar13 < Key->NumRenderTargets; uVar13 = uVar13 + 1) {
        pcVar14 = ", ";
        if (uVar13 == 0) {
          pcVar14 = "";
        }
        poVar10 = std::operator<<(local_1a8,pcVar14);
        pTVar11 = GetTextureFormatAttribs(Key->RTVFormats[uVar13]);
        std::operator<<(poVar10,pTVar11->Name);
      }
    }
    if (Key->EnableVRS == true) {
      std::operator<<(local_1a8,"; VRS");
    }
    std::__cxx11::stringbuf::str();
    RPDesc.super_DeviceObjectAttribs.Name = PassName._M_dataplus._M_p;
    pRenderPass.m_pObject = (RenderPassVkImpl *)0x0;
    RenderDeviceVkImpl::CreateRenderPass
              (this->m_DeviceVkImpl,&RPDesc,(IRenderPass **)&pRenderPass,true);
    RVar8 = pRenderPass;
    if (pRenderPass.m_pObject == (RenderPassVkImpl *)0x0) {
      FormatString<char[29]>(&msg_1,(char (*) [29])"Failed to create render pass");
      DebugAssertionFailed
                (msg_1._M_dataplus._M_p,"GetRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassCache.cpp"
                 ,0xf4);
      std::__cxx11::string::~string((string *)&msg_1);
      _Var9._M_cur = (__node_type *)0x0;
    }
    else {
      pVar17 = std::
               _Hashtable<Diligent::RenderPassCache::RenderPassCacheKey,std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>,std::allocator<std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,Diligent::RenderPassCache::RenderPassCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               ::
               _M_emplace<Diligent::RenderPassCache::RenderPassCacheKey_const&,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>
                         ((_Hashtable<Diligent::RenderPassCache::RenderPassCacheKey,std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>,std::allocator<std::pair<Diligent::RenderPassCache::RenderPassCacheKey_const,Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>>>,std::__detail::_Select1st,std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,Diligent::RenderPassCache::RenderPassCacheKeyHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           *)&this->m_Cache,Key,&pRenderPass);
      _Var9._M_cur = (__node_type *)
                     pVar17.first.
                     super__Node_iterator_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
                     ._M_cur;
    }
    RefCntAutoPtr<Diligent::RenderPassVkImpl>::Release(&pRenderPass);
    std::__cxx11::string::~string((string *)&PassName);
    std::__cxx11::stringstream::~stringstream((stringstream *)&PassNameSS);
    if (RVar8.m_pObject == (RenderPassVkImpl *)0x0) {
      pRVar16 = (RenderPassVkImpl *)0x0;
      goto LAB_00223332;
    }
  }
  pRVar16 = *(RenderPassVkImpl **)
             ((long)&((_Var9._M_cur)->
                     super__Hash_node_value<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>,_true>
                     ).
                     super__Hash_node_value_base<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>
                     ._M_storage._M_storage + 0x20);
LAB_00223332:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return pRVar16;
}

Assistant:

RenderPassVkImpl* RenderPassCache::GetRenderPass(const RenderPassCacheKey& Key)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    auto                        it = m_Cache.find(Key);
    if (it == m_Cache.end())
    {
        // Do not zero-initialize arrays
        std::array<RenderPassAttachmentDesc, MAX_RENDER_TARGETS + 2> Attachments;
        std::array<AttachmentReference, MAX_RENDER_TARGETS + 2>      AttachmentReferences;

        TEXTURE_FORMAT SRFormat = TEX_FORMAT_UNKNOWN;
        uint2          SRTileSize;
        if (Key.EnableVRS)
        {
            const ShadingRateProperties& SRProps = m_DeviceVkImpl.GetAdapterInfo().ShadingRate;
            switch (SRProps.Format)
            {
                case SHADING_RATE_FORMAT_PALETTE: SRFormat = TEX_FORMAT_R8_UINT; break;
                case SHADING_RATE_FORMAT_UNORM8: SRFormat = TEX_FORMAT_RG8_UNORM; break;
                default:
                    UNEXPECTED("Unexpected shading rate format");
            }
            SRTileSize = {SRProps.MaxTileSize[0], SRProps.MaxTileSize[1]};
        }

        SubpassDesc           Subpass;
        ShadingRateAttachment ShadingRate;

        RenderPassDesc RPDesc = GetImplicitRenderPassDesc(Key.NumRenderTargets, Key.RTVFormats, Key.DSVFormat, Key.ReadOnlyDSV, Key.SampleCount,
                                                          SRFormat, SRTileSize, Attachments, AttachmentReferences, Subpass, ShadingRate);

        std::stringstream PassNameSS;
        PassNameSS << "Implicit render pass: RT count: " << Uint32{Key.NumRenderTargets} << "; sample count: " << Uint32{Key.SampleCount}
                   << "; DSV Format: " << GetTextureFormatAttribs(Key.DSVFormat).Name;
        if (Key.NumRenderTargets > 0)
        {
            PassNameSS << (Key.NumRenderTargets > 1 ? "; RTV Formats: " : "; RTV Format: ");
            for (Uint32 rt = 0; rt < Key.NumRenderTargets; ++rt)
            {
                PassNameSS << (rt > 0 ? ", " : "") << GetTextureFormatAttribs(Key.RTVFormats[rt]).Name;
            }
        }
        if (Key.EnableVRS)
            PassNameSS << "; VRS";

        const std::string PassName{PassNameSS.str()};
        RPDesc.Name = PassName.c_str();

        RefCntAutoPtr<RenderPassVkImpl> pRenderPass;
        m_DeviceVkImpl.CreateRenderPass(RPDesc, pRenderPass.RawDblPtr<IRenderPass>(), /* IsDeviceInternal = */ true);
        if (pRenderPass == nullptr)
        {
            UNEXPECTED("Failed to create render pass");
            return nullptr;
        }
        it = m_Cache.emplace(Key, std::move(pRenderPass)).first;
    }

    return it->second;
}